

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::draw
          (PrimitiveRestartCase *this,int startNdx,int count)

{
  IndexType IVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  uint uVar5;
  GLuint end;
  GLenum mode;
  ulong uVar6;
  uint uVar7;
  GLenum type;
  
  uVar2 = this->m_primType - PRIMITIVE_LINE_STRIP;
  mode = 0;
  if (uVar2 < 6) {
    mode = *(GLenum *)(&DAT_01c007a4 + (ulong)uVar2 * 4);
  }
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    uVar2 = 0xff;
    type = 0x1401;
  }
  else {
    if (IVar1 == INDEX_UNSIGNED_INT) {
      type = 0x1405;
    }
    else {
      if (IVar1 == INDEX_UNSIGNED_SHORT) {
        uVar2 = 0xffff;
        type = 0x1403;
        goto LAB_01196922;
      }
      type = 0;
    }
    uVar2 = -(uint)(IVar1 == INDEX_UNSIGNED_INT);
  }
LAB_01196922:
  if (this->m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED) {
    if (IVar1 == INDEX_UNSIGNED_INT) {
      puVar4 = (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + startNdx;
    }
    else if (IVar1 == INDEX_UNSIGNED_SHORT) {
      puVar4 = (pointer)((this->m_indicesUS).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + startNdx);
    }
    else if (IVar1 == INDEX_UNSIGNED_BYTE) {
      puVar4 = (pointer)((this->m_indicesUB).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + startNdx);
    }
    else {
      puVar4 = (pointer)0x0;
    }
    glwDrawElementsInstanced(mode,count,type,puVar4,1);
    return;
  }
  if (this->m_function != FUNCTION_DRAW_ELEMENTS) {
    uVar3 = getNumIndices(this);
    if ((int)uVar3 < 1) {
      end = 0;
    }
    else {
      uVar6 = 0;
      end = 0;
      do {
        if (IVar1 == INDEX_UNSIGNED_INT) {
          uVar7 = (this->m_indicesUI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar6];
        }
        else if (IVar1 == INDEX_UNSIGNED_SHORT) {
          uVar7 = (uint)(this->m_indicesUS).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar6];
        }
        else {
          uVar7 = 0;
          if (IVar1 == INDEX_UNSIGNED_BYTE) {
            uVar7 = (uint)(this->m_indicesUB).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar6];
          }
        }
        uVar5 = end;
        if (end < uVar7) {
          uVar5 = uVar7;
        }
        if (uVar7 == uVar2) {
          uVar5 = end;
        }
        end = uVar5;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
    if (IVar1 == INDEX_UNSIGNED_INT) {
      puVar4 = (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + startNdx;
    }
    else if (IVar1 == INDEX_UNSIGNED_SHORT) {
      puVar4 = (pointer)((this->m_indicesUS).
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start + startNdx);
    }
    else if (IVar1 == INDEX_UNSIGNED_BYTE) {
      puVar4 = (pointer)((this->m_indicesUB).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start + startNdx);
    }
    else {
      puVar4 = (pointer)0x0;
    }
    glwDrawRangeElements(mode,0,end,count,type,puVar4);
    return;
  }
  if (IVar1 == INDEX_UNSIGNED_INT) {
    puVar4 = (this->m_indicesUI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start + startNdx;
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    puVar4 = (pointer)((this->m_indicesUS).
                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                       super__Vector_impl_data._M_start + startNdx);
  }
  else if (IVar1 == INDEX_UNSIGNED_BYTE) {
    puVar4 = (pointer)((this->m_indicesUB).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + startNdx);
  }
  else {
    puVar4 = (pointer)0x0;
  }
  glwDrawElements(mode,count,type,puVar4);
  return;
}

Assistant:

void PrimitiveRestartCase::draw (int startNdx, int count)
{
	GLenum primTypeGL;

	switch (m_primType)
	{
		case PRIMITIVE_POINTS:			primTypeGL = GL_POINTS;			break;
		case PRIMITIVE_LINE_STRIP:		primTypeGL = GL_LINE_STRIP;		break;
		case PRIMITIVE_LINE_LOOP:		primTypeGL = GL_LINE_LOOP;		break;
		case PRIMITIVE_LINES:			primTypeGL = GL_LINES;			break;
		case PRIMITIVE_TRIANGLE_STRIP:	primTypeGL = GL_TRIANGLE_STRIP;	break;
		case PRIMITIVE_TRIANGLE_FAN:	primTypeGL = GL_TRIANGLE_FAN;	break;
		case PRIMITIVE_TRIANGLES:		primTypeGL = GL_TRIANGLES;		break;
		default:
			DE_ASSERT(DE_FALSE);
			primTypeGL = 0;
	}

	GLenum indexTypeGL;

	switch (m_indexType)
	{
		case INDEX_UNSIGNED_BYTE:	indexTypeGL = GL_UNSIGNED_BYTE;		break;
		case INDEX_UNSIGNED_SHORT:	indexTypeGL = GL_UNSIGNED_SHORT;	break;
		case INDEX_UNSIGNED_INT:	indexTypeGL = GL_UNSIGNED_INT;		break;
		default:
			DE_ASSERT(DE_FALSE);
			indexTypeGL = 0;
	}

	deUint32 restartIndex = m_indexType == INDEX_UNSIGNED_BYTE	? RESTART_INDEX_UNSIGNED_BYTE
						  : m_indexType == INDEX_UNSIGNED_SHORT	? RESTART_INDEX_UNSIGNED_SHORT
						  : m_indexType == INDEX_UNSIGNED_INT	? RESTART_INDEX_UNSIGNED_INT
						  : 0;

	DE_ASSERT(restartIndex != 0);

	if (m_function == FUNCTION_DRAW_ELEMENTS)
		glDrawElements(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	else if (m_function == FUNCTION_DRAW_ELEMENTS_INSTANCED)
		glDrawElementsInstanced(primTypeGL, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx), 1);
	else
	{
		DE_ASSERT(m_function == FUNCTION_DRAW_RANGE_ELEMENTS);

		// Find the largest non-restart index in the index array (for glDrawRangeElements() end parameter).

		deUint32 max = 0;

		int numIndices = getNumIndices();
		for (int i = 0; i < numIndices; i++)
		{
			deUint32 index = getIndex(i);
			if (index != restartIndex && index > max)
				max = index;
		}

		glDrawRangeElements(primTypeGL, 0, (GLuint)max, (GLsizei)count, indexTypeGL, (GLvoid*)getIndexPtr(startNdx));
	}
}